

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pageFreeArray(MemPage *pPg,int iFirst,int nCell,CellArray *pCArray)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  u8 *puVar4;
  u8 *puVar5;
  bool bVar6;
  u16 iSize;
  int iVar7;
  u8 *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  puVar4 = pPg->aData;
  if (nCell < 1) {
    puVar8 = (u8 *)0x0;
    iSize = 0;
    iVar11 = 0;
  }
  else {
    uVar3 = pPg->pBt->usableSize;
    bVar1 = pPg->hdrOffset;
    bVar2 = pPg->childPtrSize;
    lVar9 = (long)iFirst;
    iVar11 = 0;
    iVar7 = 0;
    puVar8 = (u8 *)0x0;
    do {
      puVar5 = pCArray->apCell[lVar9];
      bVar6 = true;
      if ((puVar4 + (ulong)bVar2 + (ulong)bVar1 + 8 <= puVar5) && (puVar5 < puVar4 + uVar3)) {
        uVar10 = (ulong)pCArray->szCell[lVar9];
        if (puVar8 == puVar5 + uVar10) {
          uVar10 = (ulong)(iVar7 + (uint)pCArray->szCell[lVar9]);
LAB_0014abf7:
          iVar11 = iVar11 + 1;
        }
        else {
          if (puVar8 != (u8 *)0x0) {
            freeSpace(pPg,(short)puVar8 - (short)puVar4,(u16)iVar7);
          }
          if (puVar5 + uVar10 <= puVar4 + uVar3) goto LAB_0014abf7;
          bVar6 = false;
        }
        iVar7 = (int)uVar10;
        puVar8 = puVar5;
      }
      iSize = (u16)iVar7;
      if (!bVar6) {
        return 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < nCell + iFirst);
  }
  if (puVar8 != (u8 *)0x0) {
    freeSpace(pPg,(short)puVar8 - (short)puVar4,iSize);
  }
  return iVar11;
}

Assistant:

static int pageFreeArray(
  MemPage *pPg,                   /* Page to edit */
  int iFirst,                     /* First cell to delete */
  int nCell,                      /* Cells to delete */
  CellArray *pCArray              /* Array of cells */
){
  u8 * const aData = pPg->aData;
  u8 * const pEnd = &aData[pPg->pBt->usableSize];
  u8 * const pStart = &aData[pPg->hdrOffset + 8 + pPg->childPtrSize];
  int nRet = 0;
  int i;
  int iEnd = iFirst + nCell;
  u8 *pFree = 0;
  int szFree = 0;

  for(i=iFirst; i<iEnd; i++){
    u8 *pCell = pCArray->apCell[i];
    if( SQLITE_WITHIN(pCell, pStart, pEnd) ){
      int sz;
      /* No need to use cachedCellSize() here.  The sizes of all cells that
      ** are to be freed have already been computing while deciding which
      ** cells need freeing */
      sz = pCArray->szCell[i];  assert( sz>0 );
      if( pFree!=(pCell + sz) ){
        if( pFree ){
          assert( pFree>aData && (pFree - aData)<65536 );
          freeSpace(pPg, (u16)(pFree - aData), szFree);
        }
        pFree = pCell;
        szFree = sz;
        if( pFree+sz>pEnd ){
          return 0;
        }
      }else{
        pFree = pCell;
        szFree += sz;
      }
      nRet++;
    }
  }
  if( pFree ){
    assert( pFree>aData && (pFree - aData)<65536 );
    freeSpace(pPg, (u16)(pFree - aData), szFree);
  }
  return nRet;
}